

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::AddContextHook(ImGuiContext_conflict1 *ctx,ImGuiContextHook *hook)

{
  uint uVar1;
  int *piVar2;
  ImGuiContextHook *pIVar3;
  void *pvVar4;
  ImGuiContextHookType IVar5;
  ImGuiID IVar6;
  undefined4 uVar7;
  int iVar8;
  ImGuiID IVar9;
  ImGuiContextHook *pIVar10;
  int iVar11;
  int iVar12;
  
  if (((hook->Callback == (ImGuiContextHookCallback)0x0) || (hook->HookId != 0)) ||
     (hook->Type == ImGuiContextHookType_PendingRemoval_)) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xdba,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  iVar8 = (ctx->Hooks).Size;
  if (iVar8 == (ctx->Hooks).Capacity) {
    if (iVar8 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar8 / 2 + iVar8;
    }
    iVar12 = iVar8 + 1;
    if (iVar8 + 1 < iVar11) {
      iVar12 = iVar11;
    }
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + 1;
    }
    pIVar10 = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar12 << 5,GImAllocatorUserData);
    pIVar3 = (ctx->Hooks).Data;
    if (pIVar3 != (ImGuiContextHook *)0x0) {
      memcpy(pIVar10,pIVar3,(long)(ctx->Hooks).Size << 5);
      pIVar3 = (ctx->Hooks).Data;
      if ((pIVar3 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (ctx->Hooks).Data = pIVar10;
    (ctx->Hooks).Capacity = iVar12;
    iVar8 = (ctx->Hooks).Size;
  }
  else {
    pIVar10 = (ctx->Hooks).Data;
  }
  IVar9 = hook->HookId;
  IVar5 = hook->Type;
  IVar6 = hook->Owner;
  uVar7 = *(undefined4 *)&hook->field_0xc;
  pvVar4 = hook->UserData;
  pIVar10[iVar8].Callback = hook->Callback;
  (&pIVar10[iVar8].Callback)[1] = (ImGuiContextHookCallback)pvVar4;
  pIVar10 = pIVar10 + iVar8;
  pIVar10->HookId = IVar9;
  pIVar10->Type = IVar5;
  pIVar10->Owner = IVar6;
  *(undefined4 *)&pIVar10->field_0xc = uVar7;
  iVar8 = (ctx->Hooks).Size;
  IVar9 = ctx->HookIdNext;
  uVar1 = iVar8 + 1;
  (ctx->Hooks).Size = uVar1;
  IVar9 = IVar9 + 1;
  ctx->HookIdNext = IVar9;
  if (-1 < iVar8) {
    (ctx->Hooks).Data[(ulong)uVar1 - 1].HookId = IVar9;
    return IVar9;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x70f,"T &ImVector<ImGuiContextHook>::back() [T = ImGuiContextHook]");
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}